

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O1

int Test_SUNLinSolSpace(SUNLinearSolver S,int myid)

{
  int iVar1;
  long leniw;
  long lenrw;
  undefined8 local_20;
  undefined8 local_18;
  
  iVar1 = SUNLinSolSpace(S,&local_18,&local_20);
  sync_device();
  if (iVar1 == 0) {
    if (myid != 0) {
      return 0;
    }
    iVar1 = 0;
    printf("    PASSED test -- SUNLinSolSpace, lenrw = %li, leniw = %li\n",local_18,local_20);
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSpace, Proc %d \n",myid);
    iVar1 = 1;
  }
  if (print_time != 0) {
    printf("    SUNLinSolSpace Time: %22.15e \n \n",0);
  }
  return iVar1;
}

Assistant:

int Test_SUNLinSolSpace(SUNLinearSolver S, int myid)
{
  int failure;
  double start_time, stop_time;
  long int lenrw, leniw;

  /* call SUNLinSolSpace (failure based on output flag) */
  start_time = get_time();
  failure    = SUNLinSolSpace(S, &lenrw, &leniw);
  sync_device();
  stop_time = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSpace, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolSpace Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSpace, lenrw = %li, leniw = %li\n",
           lenrw, leniw);
    PRINT_TIME("    SUNLinSolSpace Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}